

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolize.cc
# Opt level: O1

bool google::GetSectionHeaderByType
               (int fd,Elf64_Half sh_num,size_t sh_offset,Elf64_Word type,Elf64_Shdr *out)

{
  Elf64_Word *pEVar1;
  undefined8 uVar2;
  Elf64_Xword EVar3;
  Elf64_Addr EVar4;
  Elf64_Off EVar5;
  Elf64_Xword EVar6;
  undefined8 uVar7;
  Elf64_Xword EVar8;
  byte in_AL;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  size_t count;
  undefined8 *puVar12;
  undefined6 in_register_00000032;
  undefined8 *puVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  Elf64_Shdr buf [16];
  byte local_444;
  undefined8 local_438;
  
  uVar14 = CONCAT62(in_register_00000032,sh_num) & 0xffffffff;
  uVar15 = 0;
  do {
    lVar11 = uVar14 - uVar15;
    if (uVar14 < uVar15 || lVar11 == 0) {
      local_444 = 0;
      break;
    }
    count = lVar11 * 0x40;
    if (0x3ff < count) {
      count = 0x400;
    }
    uVar9 = ReadFromOffset(fd,&local_438,count,uVar15 * 0x40 + sh_offset);
    if (uVar9 == 0xffffffffffffffff) {
      bVar16 = false;
      local_444 = 0;
    }
    else {
      if (((uVar9 & 0x3f) != 0) || (0x43f < uVar9)) {
        abort();
      }
      uVar10 = uVar9 >> 6;
      bVar16 = uVar9 == 0;
      local_444 = in_AL;
      if (!bVar16) {
        puVar12 = &local_438;
        if (local_438._4_4_ != type) {
          uVar9 = 0;
          puVar13 = &local_438;
          do {
            if (uVar10 - 1 == uVar9) {
              bVar16 = true;
              goto LAB_001211ed;
            }
            puVar12 = puVar13 + 8;
            uVar9 = uVar9 + 1;
            pEVar1 = (Elf64_Word *)((long)puVar13 + 0x44);
            puVar13 = puVar12;
          } while (*pEVar1 != type);
          bVar16 = uVar10 <= uVar9;
        }
        uVar2 = *puVar12;
        EVar3 = puVar12[1];
        EVar4 = puVar12[2];
        EVar5 = puVar12[3];
        EVar6 = puVar12[4];
        uVar7 = puVar12[5];
        EVar8 = puVar12[7];
        out->sh_addralign = puVar12[6];
        out->sh_entsize = EVar8;
        out->sh_size = EVar6;
        out->sh_link = (int)uVar7;
        out->sh_info = (int)((ulong)uVar7 >> 0x20);
        out->sh_addr = EVar4;
        out->sh_offset = EVar5;
        out->sh_name = (int)uVar2;
        out->sh_type = (int)((ulong)uVar2 >> 0x20);
        out->sh_flags = EVar3;
        local_444 = 1;
        uVar10 = 0;
      }
LAB_001211ed:
      uVar15 = uVar15 + uVar10;
    }
    in_AL = local_444;
  } while (bVar16);
  return (bool)(local_444 & 1);
}

Assistant:

static ATTRIBUTE_NOINLINE bool GetSectionHeaderByType(const int fd,
                                                      ElfW(Half) sh_num,
                                                      const size_t sh_offset,
                                                      ElfW(Word) type,
                                                      ElfW(Shdr) * out) {
  // Read at most 16 section headers at a time to save read calls.
  ElfW(Shdr) buf[16];
  for (size_t i = 0; i < sh_num;) {
    const size_t num_bytes_left = (sh_num - i) * sizeof(buf[0]);
    const size_t num_bytes_to_read =
        (sizeof(buf) > num_bytes_left) ? num_bytes_left : sizeof(buf);
    const ssize_t len = ReadFromOffset(fd, buf, num_bytes_to_read,
                                       sh_offset + i * sizeof(buf[0]));
    if (len == -1) {
      return false;
    }
    GLOG_SAFE_ASSERT(static_cast<size_t>(len) % sizeof(buf[0]) == 0);
    const size_t num_headers_in_buf = static_cast<size_t>(len) / sizeof(buf[0]);
    GLOG_SAFE_ASSERT(num_headers_in_buf <= sizeof(buf) / sizeof(buf[0]));
    for (size_t j = 0; j < num_headers_in_buf; ++j) {
      if (buf[j].sh_type == type) {
        *out = buf[j];
        return true;
      }
    }
    i += num_headers_in_buf;
  }
  return false;
}